

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void SetupServerArgs(ArgsManager *argsman,bool can_listen_ipc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint16_t uVar5;
  undefined1 *puVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char **ppcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Alloc_hider _Var11;
  undefined4 uVar12;
  ChainType chain;
  undefined7 in_register_00000031;
  OptionsCategory *pOVar13;
  OptionsCategory *pOVar14;
  bool *pbVar15;
  long lVar16;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hidden_args;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> regtestChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> signetChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> testnet4ChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> testnetChainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> defaultChainParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  char cVar17;
  uint16_t local_246;
  OptionsCategory local_244;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  undefined1 local_228 [8];
  undefined1 local_220 [8];
  undefined1 local_218 [8];
  undefined1 local_210 [8];
  undefined1 local_208 [8];
  undefined8 local_200;
  default_delete<CBaseChainParams> local_1f8 [8];
  default_delete<CBaseChainParams> local_1f0 [8];
  default_delete<CBaseChainParams> local_1e8 [8];
  CBaseChainParams *local_1e0;
  string local_1d8;
  string local_1b8;
  string local_198;
  undefined1 local_178 [32];
  string local_158;
  _Base_ptr local_138 [2];
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Base_ptr local_d8 [2];
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  undefined1 local_a8 [16];
  _Base_ptr local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  uVar12 = (undefined4)CONCAT71(in_register_00000031,can_listen_ipc);
  local_58._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  SetupHelpOptions(argsman);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-help-debug","");
  pcVar2 = local_58 + 0x10;
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Print help message with debugging options and exit","");
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  init::AddLoggingArgs(argsman);
  CreateBaseChainParams((ChainType)&local_1e0);
  CreateBaseChainParams((ChainType)local_1e8);
  CreateBaseChainParams((ChainType)local_1f0);
  CreateBaseChainParams((ChainType)local_1f8);
  CreateBaseChainParams((ChainType)&local_200);
  chain = (ChainType)argsman;
  CreateChainParams((ArgsManager *)local_208,chain);
  CreateChainParams((ArgsManager *)local_210,chain);
  CreateChainParams((ArgsManager *)local_218,chain);
  CreateChainParams((ArgsManager *)local_220,chain);
  CreateChainParams((ArgsManager *)local_228,chain);
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-dbcrashratio","");
  local_138[0] = (_Base_ptr)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"-forcecompactdb","");
  local_118._M_allocated_capacity = (size_type)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_128 + 0x10),"-choosedatadir","");
  local_f8._M_allocated_capacity = (size_type)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_108 + 0x10),"-lang=<lang>","");
  local_d8[0] = (_Base_ptr)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-min","");
  local_b8 = (_Base_ptr)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-resetguisettings","");
  local_98 = (_Base_ptr)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-splash","");
  _Var11._M_p = local_78 + 0x10;
  local_78._0_8_ = _Var11._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-uiplatform","");
  __l._M_len = 8;
  __l._M_array = &local_158;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_240,__l,(allocator_type *)local_58);
  lVar16 = -0x100;
  do {
    if ((_List_node_base *)_Var11._M_p != ((_List_node_base *)((long)_Var11._M_p + -0x10))->_M_next)
    {
      operator_delete(((_List_node_base *)((long)_Var11._M_p + -0x10))->_M_next,
                      (ulong)((long)&((_List_node_base *)_Var11._M_p)->_M_next->_M_next + 1));
    }
    _Var11._M_p = _Var11._M_p + -0x20;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0);
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-version","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Print version and exit","");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-alertnotify=<cmd>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Execute command when an alert is raised (%s in cmd is replaced by message)","");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-assumevalid=<hex>","");
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_178,(void *)((long)local_208 + 0x130));
  base_blob<256u>::GetHex_abi_cxx11_(&local_198,(void *)((long)local_210 + 0x130));
  base_blob<256u>::GetHex_abi_cxx11_(&local_1b8,(void *)((long)local_218 + 0x130));
  base_blob<256u>::GetHex_abi_cxx11_(&local_1d8,(void *)((long)local_220 + 0x130));
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "If this block is in the chain assume that it and its ancestors are valid and potentially skip their script verification (0 to verify all, default: %s, testnet3: %s, testnet4: %s, signet: %s)"
             ,local_178,&local_198,&local_1b8,&local_1d8,in_stack_fffffffffffffda8);
  local_244 = OPTIONS;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,&local_244);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_1d8._M_dataplus._M_p._2_2_,local_1d8._M_dataplus._M_p._0_2_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != &local_1d8.field_2) {
    operator_delete(puVar6,(ulong)(local_1d8.field_2._M_allocated_capacity + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_1b8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_1b8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_1b8._M_dataplus._M_p._1_1_,
                                      local_1b8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != &local_1b8.field_2) {
    operator_delete(puVar6,(ulong)(local_1b8.field_2._M_allocated_capacity + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_198._M_dataplus._M_p._4_4_,
                    CONCAT22(local_198._M_dataplus._M_p._2_2_,
                             CONCAT11(local_198._M_dataplus._M_p._1_1_,
                                      local_198._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != &local_198.field_2) {
    operator_delete(puVar6,(ulong)(local_198.field_2._M_allocated_capacity + 1));
  }
  if ((_Base_ptr)local_178._0_8_ != (_Base_ptr)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blocksdir=<dir>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Specify directory to hold blocks subdirectory for *.dat files (default: <datadir>)",""
            );
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blocksxor","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Whether an XOR-key applies to blocksdir *.dat files. The created XOR-key will be zeros for an existing blocksdir or when `-blocksxor=0` is set, and random for a freshly initialized blocksdir. (default: %u)"
             ,(bool *)&kernel::DEFAULT_XOR_BLOCKSDIR);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-fastprune","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Use smaller block files and lower minimum prune height for testing purposes","");
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blocknotify=<cmd>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Execute command when the best block changes (%s in cmd is replaced by block hash)","")
  ;
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-blockreconstructionextratxn=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Extra transactions to keep in memory for compact block reconstructions (default: %u)",
             &DEFAULT_BLOCK_RECONSTRUCTION_EXTRA_TXN);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blocksonly","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Whether to reject transactions from network peers. Disables automatic broadcast and rebroadcast of transactions, unless the source peer has the \'forcerelay\' permission. RPC transactions are not affected. (default: %u)"
             ,(bool *)&DEFAULT_BLOCKSONLY);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-coinstatsindex","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Maintain coinstats index used by the gettxoutsetinfo RPC (default: %u)",
             (bool *)&DEFAULT_COINSTATSINDEX);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ppcVar9 = (char **)0x1;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-conf=<file>","");
  tinyformat::format<char_const*>
            ((string *)local_58,
             (tinyformat *)
             "Specify path to read-only configuration file. Relative paths will be prefixed by datadir location (only useable from command line, not configuration file) (default: %s)"
             ,(char *)&BITCOIN_CONF_FILENAME,ppcVar9);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-datadir=<dir>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Specify data directory","");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-dbbatchsize","");
  tinyformat::format<long>
            ((string *)local_58,"Maximum database write batch size in bytes (default: %u)",
             &nDefaultDbBatchSize);
  pOVar13 = (OptionsCategory *)local_178;
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,pOVar13);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-dbcache=<n>","");
  tinyformat::format<long,long>
            ((string *)local_58,
             (tinyformat *)
             "Maximum database cache size <n> MiB (minimum %d, default: %d). Make sure you have enough RAM. In addition, unused memory allocated to the mempool is shared with this cache (see -maxmempool)."
             ,(char *)&nMinDbCache,&nDefaultDbCache,(long *)pOVar13);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-includeconf=<file>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Specify additional configuration file, relative to the -datadir path (only useable from configuration file, not command line)"
             ,"");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ppcVar9 = (char **)0x1;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-allowignoredconf","");
  tinyformat::format<char_const*>
            ((string *)local_58,
             (tinyformat *)
             "For backwards compatibility, treat an unused %s file in the datadir as a warning, not an error."
             ,(char *)&BITCOIN_CONF_FILENAME,ppcVar9);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-loadblock=<file>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Imports blocks from external file on startup","");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxmempool=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,"Keep the transaction memory pool below <n> megabytes (default: %u)"
             ,&DEFAULT_MAX_MEMPOOL_SIZE_MB);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxorphantx=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Keep at most <n> unconnectable transactions in memory (default: %u)",
             &DEFAULT_MAX_ORPHAN_TRANSACTIONS);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-mempoolexpiry=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Do not keep transactions in the mempool longer than <n> hours (default: %u)",
             &DEFAULT_MEMPOOL_EXPIRY_HOURS);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-minimumchainwork=<hex>","")
  ;
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_178,(void *)((long)local_208 + 0x110));
  base_blob<256u>::GetHex_abi_cxx11_(&local_198,(void *)((long)local_210 + 0x110));
  base_blob<256u>::GetHex_abi_cxx11_(&local_1b8,(void *)((long)local_218 + 0x110));
  base_blob<256u>::GetHex_abi_cxx11_(&local_1d8,(void *)((long)local_220 + 0x110));
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "Minimum work assumed to exist on a valid chain in hex (default: %s, testnet3: %s, testnet4: %s, signet: %s)"
             ,local_178,&local_198,&local_1b8,&local_1d8,in_stack_fffffffffffffda8);
  pOVar13 = &local_244;
  local_244 = OPTIONS;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,pOVar13);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_1d8._M_dataplus._M_p._2_2_,local_1d8._M_dataplus._M_p._0_2_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != &local_1d8.field_2) {
    operator_delete(puVar6,(ulong)(local_1d8.field_2._M_allocated_capacity + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_1b8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_1b8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_1b8._M_dataplus._M_p._1_1_,
                                      local_1b8._M_dataplus._M_p._0_1_)));
  p_Var3 = (_Base_ptr)(local_178 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != &local_1b8.field_2) {
    operator_delete(puVar6,(ulong)(local_1b8.field_2._M_allocated_capacity + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_198._M_dataplus._M_p._4_4_,
                    CONCAT22(local_198._M_dataplus._M_p._2_2_,
                             CONCAT11(local_198._M_dataplus._M_p._1_1_,
                                      local_198._M_dataplus._M_p._0_1_)));
  paVar4 = &local_198.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != paVar4) {
    operator_delete(puVar6,(ulong)(local_198.field_2._M_allocated_capacity + 1));
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-par=<n>","");
  tinyformat::format<int,int>
            ((string *)local_58,
             (tinyformat *)
             "Set the number of script verification threads (0 = auto, up to %d, <0 = leave that many cores free, default: %d)"
             ,(char *)&MAX_SCRIPTCHECK_THREADS,&DEFAULT_SCRIPTCHECK_THREADS,(int *)pOVar13);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-persistmempool","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Whether to save the mempool on shutdown and load on restart (default: %u)",
             (bool *)&node::DEFAULT_PERSIST_MEMPOOL);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-persistmempoolv1","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Whether a mempool.dat file created by -persistmempool or the savemempool RPC will be written in the legacy format (version 1) or the current format (version 2). This temporary option will be removed in the future. (default: %u)"
             ,(bool *)&DEFAULT_PERSIST_V1_DAT);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ppcVar9 = (char **)0x1;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-pid=<file>","");
  tinyformat::format<char_const*>
            ((string *)local_58,
             (tinyformat *)
             "Specify pid file. Relative paths will be prefixed by a net-specific datadir location. (default: %s)"
             ,(char *)&BITCOIN_PID_FILENAME,ppcVar9);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-prune=<n>","");
  local_178._0_8_ = (_Base_ptr)0x226;
  tinyformat::format<unsigned_long>
            ((string *)local_58,
             "Reduce storage requirements by enabling pruning (deleting) of old blocks. This allows the pruneblockchain RPC to be called to delete specific blocks and enables automatic pruning of old blocks if a target size in MiB is provided. This mode is incompatible with -txindex. Warning: Reverting this setting requires re-downloading the entire blockchain. (default: 0 = disable pruning blocks, 1 = allow manual pruning via RPC, >=%u = automatically prune block files to stay under the specified target size in MiB)"
             ,(unsigned_long *)local_178);
  local_198._M_dataplus._M_p._0_1_ = _S_red;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-reindex","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "If enabled, wipe chain state and block index, and rebuild them from blk*.dat files on disk. Also wipe and rebuild other optional indexes that are active. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC."
             ,"");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-reindex-chainstate","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "If enabled, wipe chain state, and rebuild it from blk*.dat files on disk. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC."
             ,"");
  ppcVar9 = (char **)local_178;
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)ppcVar9);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-settings=<file>","");
  tinyformat::format<char_const*,char_const*>
            ((string *)local_58,
             (tinyformat *)
             "Specify path to dynamic settings data file. Can be disabled with -nosettings. File is written at runtime and not meant to be edited by users (use %s instead for custom settings). Relative paths will be prefixed by datadir location. (default: %s)"
             ,(char *)&BITCOIN_CONF_FILENAME,&BITCOIN_SETTINGS_FILENAME,ppcVar9);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-startupnotify=<cmd>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Execute command on startup.","");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-shutdownnotify=<cmd>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Execute command immediately before beginning shutdown. The need for shutdown may be urgent, so be careful not to delay it long (if the command doesn\'t require interaction with the server, consider having it fork into the background)."
             ,"");
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-txindex","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Maintain a full transaction index, used by the getrawtransaction rpc call (default: %u)"
             ,(bool *)&DEFAULT_TXINDEX);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)pbVar8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-blockfilterindex=<type>","");
  psVar7 = ListBlockFilterTypes_abi_cxx11_();
  tinyformat::format<char_const*,std::__cxx11::string>
            ((string *)local_178,
             (tinyformat *)
             "Maintain an index of compact filters by block (default: %s, values: %s).",
             (char *)&DEFAULT_BLOCKFILTERINDEX,(char **)psVar7,pbVar8);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,
                      " If <type> is not supplied or if <type> = 1, indexes for all known types are enabled."
                     );
  local_58._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar10) {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
    local_58._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_58._0_8_ = pcVar2;
  }
  else {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_198._M_dataplus._M_p._0_1_ = _S_red;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-addnode=<ip>","");
  tinyformat::format<int>
            ((string *)local_58,
             "Add a node to connect to and attempt to keep the connection open (see the addnode RPC help for more info). This option can be specified multiple times to add multiple nodes; connections are limited to %u at a time and are counted separately from the -maxconnections limit."
             ,&MAX_ADDNODE_CONNECTIONS);
  local_178._0_4_ = _S_black;
  ppcVar9 = (char **)0x201;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x201,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-asmap=<file>","");
  tinyformat::format<char_const*>
            ((string *)local_58,
             (tinyformat *)
             "Specify asn mapping used for bucketing of the peers (default: %s). Relative paths will be prefixed by the net-specific datadir location."
             ,(char *)&DEFAULT_ASMAP_FILENAME,ppcVar9);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-bantime=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Default duration (in seconds) of manually configured bans (default: %u)",
             &DEFAULT_MISBEHAVING_BANTIME);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-bind=<addr>[:<port>][=onion]","");
  local_198._M_dataplus._M_p._0_1_ = (undefined1)local_1e0->m_onion_service_target_port;
  local_198._M_dataplus._M_p._1_1_ = (undefined1)(local_1e0->m_onion_service_target_port >> 8);
  uVar5 = *(uint16_t *)((long)(__pthread_internal_list **)local_1e8 + 2);
  local_1b8._M_dataplus._M_p._0_1_ = (undefined1)uVar5;
  local_1b8._M_dataplus._M_p._1_1_ = (undefined1)(uVar5 >> 8);
  local_1d8._M_dataplus._M_p._0_2_ = *(uint16_t *)((long)(__pthread_internal_list **)local_1f0 + 2);
  local_244 = CONCAT22(local_244._2_2_,*(uint16_t *)((long)local_1f8 + 2));
  local_246 = *(uint16_t *)(local_200 + 2);
  tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            ((string *)local_58,
             (tinyformat *)
             "Bind to given address and always listen on it (default: 0.0.0.0). Use [host]:port notation for IPv6. Append =onion to tag any incoming connections to that address and port as incoming Tor connections (default: 127.0.0.1:%u=onion, testnet3: 127.0.0.1:%u=onion, testnet4: 127.0.0.1:%u=onion, signet: 127.0.0.1:%u=onion, regtest: 127.0.0.1:%u=onion)"
             ,(char *)&local_198,(unsigned_short *)&local_1b8,(unsigned_short *)&local_1d8,
             (unsigned_short *)&local_244,&local_246,
             (unsigned_short *)CONCAT44(uVar12,in_stack_fffffffffffffdb0));
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x201,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-cjdnsreachable","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "If set, then this host is configured for CJDNS (connecting to fc00::/8 addresses would lead us to the CJDNS network, see doc/cjdns.md) (default: 0)"
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-connect=<ip>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Connect only to the specified node; -noconnect disables automatic connections (the rules for this peer are the same as for -addnode). This option can be specified multiple times to connect to multiple nodes."
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x201,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-discover","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Discover own IP addresses (default: 1 when listening and no -externalip or -proxy)",""
            );
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-dns","");
  tinyformat::format<int>
            ((string *)local_58,
             "Allow DNS lookups for -addnode, -seednode and -connect (default: %u)",
             &DEFAULT_NAME_LOOKUP);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-dnsseed","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Query for peer addresses via DNS lookup, if low on addresses (default: %u unless -connect used or -maxconnections=0)"
             ,(bool *)&DEFAULT_DNSSEED);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-externalip=<ip>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Specify your own public address","");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-fixedseeds","");
  tinyformat::format<bool>
            ((string *)local_58,"Allow fixed seeds if DNS seeds don\'t provide peers (default: %u)",
             &DEFAULT_FIXEDSEEDS);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-forcednsseed","");
  tinyformat::format<bool>
            ((string *)local_58,"Always query for peer addresses via DNS lookup (default: %u)",
             (bool *)&DEFAULT_FORCEDNSSEED);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-listen","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Accept connections from outside (default: %u if no -proxy, -connect or -maxconnections=0)"
             ,(bool *)&DEFAULT_LISTEN);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-listenonion","");
  tinyformat::format<bool>
            ((string *)local_58,"Automatically create Tor onion service (default: %d)",
             (bool *)&DEFAULT_LISTEN_ONION);
  pOVar13 = (OptionsCategory *)local_178;
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,pOVar13);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxconnections=<n>","");
  tinyformat::format<unsigned_int,int>
            ((string *)local_58,
             (tinyformat *)
             "Maintain at most <n> automatic connections to peers (default: %u). This limit does not apply to connections manually added via -addnode or the addnode RPC, which have a separate limit of %u."
             ,"}",&MAX_ADDNODE_CONNECTIONS,(int *)pOVar13);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxreceivebuffer=<n>","");
  tinyformat::format<unsigned_long>
            ((string *)local_58,
             "Maximum per-connection receive buffer, <n>*1000 bytes (default: %u)",
             &DEFAULT_MAXRECEIVEBUFFER);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxsendbuffer=<n>","");
  tinyformat::format<unsigned_long>
            ((string *)local_58,
             "Maximum per-connection memory usage for the send buffer, <n>*1000 bytes (default: %u)"
             ,&DEFAULT_MAXSENDBUFFER);
  local_178._0_4_ = _S_black;
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxuploadtarget=<n>","");
  tinyformat::format<std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "Tries to keep outbound traffic under the given target per 24h. Limit does not apply to peers with \'download\' permission or blocks created within past week. 0 = no limit (default: %s). Optional suffix units [k|K|m|M|g|G|t|T] (default: M). Lowercase is 1000 base while uppercase is 1024 base"
             ,(char *)&DEFAULT_MAX_UPLOAD_TARGET_abi_cxx11_,pbVar8);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-onion=<ip:port|path>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Use separate SOCKS5 proxy to reach peers via Tor onion services, set -noonion to disable (default: -proxy). May be a local file path prefixed with \'unix:\'."
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-i2psam=<ip:port>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "I2P SAM proxy to reach I2P peers and accept I2P connections (default: none)","");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-i2pacceptincoming","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Whether to accept inbound I2P connections (default: %i). Ignored if -i2psam is not set. Listening for inbound I2P connections is done through the SAM proxy, not by binding to a local address and port."
             ,(bool *)&DEFAULT_I2P_ACCEPT_INCOMING);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-onlynet=<net>","");
  GetNetworkNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1b8,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_198,(util *)&local_1b8,", ");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_198,0,0,"Make automatic outbound connections only to network <net> (",
                      0x3b);
  local_178._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ == paVar10) {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
    local_178._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_178._0_8_ = p_Var3;
  }
  else {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_178._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,
                      "). Inbound and manual connections are not affected by this option. It can be specified multiple times to allow multiple networks."
                     );
  local_58._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar10) {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
    local_58._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_58._0_8_ = pcVar2;
  }
  else {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p._0_2_ = _S_black;
  local_1d8._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)&local_1d8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_198._M_dataplus._M_p._4_4_,
                    CONCAT22(local_198._M_dataplus._M_p._2_2_,
                             CONCAT11(local_198._M_dataplus._M_p._1_1_,
                                      local_198._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != paVar4) {
    operator_delete(puVar6,(ulong)(local_198.field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-v2transport","");
  tinyformat::format<bool>
            ((string *)local_58,"Support v2 transport (default: %u)",(bool *)&DEFAULT_V2_TRANSPORT);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-peerbloomfilters","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Support filtering of blocks and transaction with bloom filters (default: %u)",
             (bool *)&DEFAULT_PEERBLOOMFILTERS);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-peerblockfilters","");
  tinyformat::format<bool>
            ((string *)local_58,"Serve compact block filters to peers per BIP 157 (default: %u)",
             (bool *)&DEFAULT_PEERBLOCKFILTERS);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-txreconciliation","");
  tinyformat::format<bool>
            ((string *)local_58,"Enable transaction reconciliations per BIP 330 (default: %d)",
             (bool *)&DEFAULT_TXRECONCILIATION_ENABLE);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-port=<port>","");
  local_198._M_dataplus._M_p._0_1_ = (undefined1)*(undefined2 *)((long)local_208 + 0x174);
  local_198._M_dataplus._M_p._1_1_ =
       (undefined1)((ushort)*(undefined2 *)((long)local_208 + 0x174) >> 8);
  local_1b8._M_dataplus._M_p._0_1_ = (undefined1)*(undefined2 *)((long)local_210 + 0x174);
  local_1b8._M_dataplus._M_p._1_1_ =
       (undefined1)((ushort)*(undefined2 *)((long)local_210 + 0x174) >> 8);
  local_1d8._M_dataplus._M_p._0_2_ = *(undefined2 *)((long)local_218 + 0x174);
  pOVar13 = &local_244;
  local_244 = CONCAT22(local_244._2_2_,*(undefined2 *)((long)local_220 + 0x174));
  local_246 = *(unsigned_short *)((long)local_228 + 0x174);
  tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            ((string *)local_58,
             (tinyformat *)
             "Listen for connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u). Not relevant for I2P (see doc/i2p.md)."
             ,(char *)&local_198,(unsigned_short *)&local_1b8,(unsigned_short *)&local_1d8,
             (unsigned_short *)pOVar13,&local_246,
             (unsigned_short *)CONCAT44(uVar12,in_stack_fffffffffffffdb0));
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x201,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-proxy=<ip:port|path>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Connect through SOCKS5 proxy, set -noproxy to disable (default: disabled). May be a local file path prefixed with \'unix:\' if the proxy supports it."
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x41,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-proxyrandomize","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Randomize credentials for every proxy connection. This enables Tor stream isolation (default: %u)"
             ,(bool *)&DEFAULT_PROXYRANDOMIZE);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-seednode=<ip>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Connect to a node to retrieve peer addresses, and disconnect. This option can be specified multiple times to connect to multiple nodes. During startup, seednodes will be tried before dnsseeds."
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-networkactive","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Enable all P2P network activity (default: 1). Can be changed by the setnetworkactive RPC command"
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-timeout=<n>","");
  tinyformat::format<int>
            ((string *)local_58,
             "Specify socket connection timeout in milliseconds. If an initial attempt to connect is unsuccessful after this amount of time, drop it (minimum: 1, default: %d)"
             ,&DEFAULT_CONNECT_TIMEOUT);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-peertimeout=<n>","");
  tinyformat::format<long>
            ((string *)local_58,
             "Specify a p2p connection timeout delay in seconds. After connecting to a peer, wait this amount of time before considering disconnection based on inactivity (minimum: 1, default: %d)"
             ,&DEFAULT_PEER_CONNECT_TIMEOUT);
  pOVar14 = (OptionsCategory *)local_178;
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,pOVar14);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-torcontrol=<ip>:<port>","")
  ;
  tinyformat::format<std::__cxx11::string,int>
            ((string *)local_58,
             (tinyformat *)
             "Tor control host and port to use if onion listening enabled (default: %s). If no port is specified, the default port of %i will be used."
             ,(char *)&DEFAULT_TOR_CONTROL_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DEFAULT_TOR_CONTROL_PORT,(int *)pOVar14);
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-torpassword=<pass>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Tor control port password (default: empty)","");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x401,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [6])"-upnp");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [8])"-natpmp");
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-whitebind=<[permissions@]addr>","");
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_198,(util *)&NET_PERMISSIONS_DOC_abi_cxx11_,", ");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_198,0,0,
                      "Bind to the given address and add permission flags to the peers connecting to it. Use [host]:port notation for IPv6. Allowed permissions: "
                      ,0x8a);
  local_178._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ == paVar10) {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
    local_178._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_178._0_8_ = p_Var3;
  }
  else {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_178._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,
                      ". Specify multiple permissions separated by commas (default: download,noban,mempool,relay). Can be specified multiple times."
                     );
  local_58._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar10) {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
    local_58._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_58._0_8_ = pcVar2;
  }
  else {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p._0_1_ = _S_black;
  local_1b8._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_1b8._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)&local_1b8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_198._M_dataplus._M_p._4_4_,
                    CONCAT22(local_198._M_dataplus._M_p._2_2_,
                             CONCAT11(local_198._M_dataplus._M_p._1_1_,
                                      local_198._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != paVar4) {
    operator_delete(puVar6,(ulong)(local_198.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-whitelist=<[permissions@]IP address or network>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Add permission flags to the peers using the given IP address (e.g. 1.2.3.4) or CIDR-notated network (e.g. 1.2.3.0/24). Uses the same permissions as -whitebind. Additional flags \"in\" and \"out\" control whether permissions apply to incoming connections and/or manual (default: incoming only). Can be specified multiple times."
             ,"");
  local_178._0_4_ = _S_black;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  (*g_wallet_init_interface->_vptr_WalletInitInterface[1])(g_wallet_init_interface,argsman);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[27]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [27])"-zmqpubhashblock=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [24])"-zmqpubhashtx=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[26]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [26])"-zmqpubrawblock=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [23])"-zmqpubrawtx=<address>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [20])"-zmqpubsequence=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [24])"-zmqpubhashblockhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [21])"-zmqpubhashtxhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [23])"-zmqpubrawblockhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [20])"-zmqpubrawtxhwm=<n>");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
             (char (*) [23])"-zmqpubsequencehwm=<n>");
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-checkblocks=<n>","");
  tinyformat::format<int>
            ((string *)local_58,"How many blocks to check at startup (default: %u, 0 = all)",
             &DEFAULT_CHECKBLOCKS);
  pOVar14 = (OptionsCategory *)local_178;
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,pOVar14);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-checklevel=<n>","");
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (local_178,(util *)&CHECKLEVEL_DOC_abi_cxx11_,", ");
  tinyformat::format<std::__cxx11::string,int>
            ((string *)local_58,
             (tinyformat *)
             "How thorough the block verification of -checkblocks is: %s (0-4, default: %u)",
             local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DEFAULT_CHECKLEVEL,(int *)pOVar14);
  psVar7 = &local_198;
  local_198._M_dataplus._M_p._0_1_ = 5;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)psVar7);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-checkblockindex","");
  local_198._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)local_208 + 0x2d0);
  local_1b8._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)local_228 + 0x2d0);
  tinyformat::format<bool,bool>
            ((string *)local_58,
             (tinyformat *)
             "Do a consistency check for the block tree, chainstate, and other validation data structures every <n> operations. Use 0 to disable. (default: %u, regtest: %u)"
             ,(char *)&local_198,(bool *)&local_1b8,(bool *)psVar7);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-checkaddrman=<n>","");
  tinyformat::format<int>
            ((string *)local_58,
             "Run addrman consistency checks every <n> operations. Use 0 to disable. (default: %u)",
             &DEFAULT_ADDRMAN_CONSISTENCY_CHECKS);
  pbVar15 = (bool *)local_178;
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)pbVar15);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-checkmempool=<n>","");
  local_198._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)local_208 + 0x2d0);
  local_1b8._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)local_228 + 0x2d0);
  tinyformat::format<bool,bool>
            ((string *)local_58,
             (tinyformat *)
             "Run mempool consistency checks every <n> transactions. Use 0 to disable. (default: %u, regtest: %u)"
             ,(char *)&local_198,(bool *)&local_1b8,pbVar15);
  pbVar15 = (bool *)local_178;
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)pbVar15);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-checkpoints","");
  lVar16 = std::_Rb_tree_decrement((_Rb_tree_node_base *)((long)local_208 + 0x2e0));
  local_178._0_4_ = *(_Rb_tree_color *)(lVar16 + 0x20);
  tinyformat::format<int,bool>
            ((string *)local_58,
             (tinyformat *)
             "Enable rejection of any forks from the known historical chain until block %s (default: %u)"
             ,local_178,(int *)&DEFAULT_CHECKPOINTS_ENABLED,pbVar15);
  local_198._M_dataplus._M_p._0_1_ = 5;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-deprecatedrpc=<method>","")
  ;
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Allows deprecated RPC method(s) to be used","");
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-stopafterblockimport","");
  tinyformat::format<bool>
            ((string *)local_58,"Stop running after importing blocks from disk (default: %u)",
             &DEFAULT_STOPAFTERBLOCKIMPORT);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-stopatheight","");
  tinyformat::format<int>
            ((string *)local_58,
             "Stop running after reaching the given height in the main chain (default: %u)",
             &node::DEFAULT_STOPATHEIGHT);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-limitancestorcount=<n>","")
  ;
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Do not accept transactions if number of in-mempool ancestors is <n> or more (default: %u)"
             ,&DEFAULT_ANCESTOR_LIMIT);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-limitancestorsize=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Do not accept transactions whose size with all in-mempool ancestors exceeds <n> kilobytes (default: %u)"
             ,&DEFAULT_ANCESTOR_SIZE_LIMIT_KVB);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-limitdescendantcount=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Do not accept transactions if any ancestor would have <n> or more in-mempool descendants (default: %u)"
             ,&DEFAULT_DESCENDANT_LIMIT);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-limitdescendantsize=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Do not accept transactions if any ancestor would have more than <n> kilobytes of in-mempool descendants (default: %u)."
             ,&DEFAULT_DESCENDANT_SIZE_LIMIT_KVB);
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-test=<option>","");
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_198,(util *)&TEST_OPTIONS_DOC_abi_cxx11_,", ");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_198,0,0,"Pass a test-only option. Options include : ",0x2b);
  local_178._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ == paVar10) {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
    local_178._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_178._0_8_ = p_Var3;
  }
  else {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_178._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,".");
  local_58._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar10) {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
    local_58._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_58._0_8_ = pcVar2;
  }
  else {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p._0_1_ = 5;
  local_1b8._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_1b8._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_1b8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_198._M_dataplus._M_p._4_4_,
                    CONCAT22(local_198._M_dataplus._M_p._2_2_,
                             CONCAT11(local_198._M_dataplus._M_p._1_1_,
                                      local_198._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != paVar4) {
    operator_delete(puVar6,(ulong)(local_198.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-capturemessages","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Capture all P2P messages to disk","");
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-mocktime=<n>","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 "Replace actual time with ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ," (default: 0)");
  local_58._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar10) {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
    local_58._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_58._0_8_ = pcVar2;
  }
  else {
    local_58._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_198._M_dataplus._M_p._0_1_ = 5;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxsigcachesize=<n>","");
  local_178._0_8_ = (_Base_ptr)0x20;
  tinyformat::format<unsigned_long>
            ((string *)local_58,
             "Limit sum of signature cache and script execution cache sizes to <n> MiB (default: %u)"
             ,(unsigned_long *)local_178);
  local_198._M_dataplus._M_p._0_1_ = 5;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-maxtipage=<n>","");
  local_178._0_8_ = (_Base_ptr)0x15180;
  tinyformat::format<long>
            ((string *)local_58,
             "Maximum tip age in seconds to consider node in initial block download (default: %u)",
             (long *)local_178);
  local_198._M_dataplus._M_p._0_1_ = 5;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-printpriority","");
  std::operator+(&local_198,"Log transaction fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_198,"/kvB when mining blocks (default: %u)");
  local_178._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ == paVar10) {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
    local_178._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_178._0_8_ = p_Var3;
  }
  else {
    local_178._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_178._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  tinyformat::format<bool>
            ((string *)local_58,(string *)local_178,(bool *)&node::DEFAULT_PRINT_MODIFIED_FEE);
  local_1b8._M_dataplus._M_p._0_1_ = 5;
  local_1b8._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_1b8._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_1b8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  puVar6 = (undefined1 *)
           CONCAT44(local_198._M_dataplus._M_p._4_4_,
                    CONCAT22(local_198._M_dataplus._M_p._2_2_,
                             CONCAT11(local_198._M_dataplus._M_p._1_1_,
                                      local_198._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 != paVar4) {
    operator_delete(puVar6,(ulong)(local_198.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-uacomment=<cmt>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Append comment to the user agent string","");
  local_178._0_4_ = 5;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  SetupChainParamsBaseOptions(argsman);
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-acceptnonstdtxn","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Relay and mine \"non-standard\" transactions (test networks only; default: %u)",
             &DEFAULT_ACCEPT_NON_STD_TXN);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)pbVar8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-incrementalrelayfee=<amt>","");
  FormatMoney_abi_cxx11_((string *)local_178,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "Fee rate (in %s/kvB) used to define cost of relay, used for mempool limiting and replacement policy. (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,pbVar8);
  psVar7 = &local_198;
  local_198._M_dataplus._M_p._0_1_ = 7;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)psVar7);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-dustrelayfee=<amt>","");
  FormatMoney_abi_cxx11_((string *)local_178,3000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "Fee rate (in %s/kvB) used to define dust, the value of an output such that it will cost more than its value in fees at this fee rate to spend it. (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,psVar7);
  local_198._M_dataplus._M_p._0_1_ = 7;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-acceptstalefeeestimates","");
  local_178._0_8_ = (_Base_ptr)0x3c;
  tinyformat::format<char[15],bool,long>
            ((string *)local_58,
             (tinyformat *)
             "Read fee estimates even if they are stale (%sdefault: %u) fee estimates are considered stale if they are %s hours old"
             ,"regtest only; ",(char (*) [15])&DEFAULT_ACCEPT_STALE_FEE_ESTIMATES,(bool *)local_178,
             (long *)pOVar13);
  local_198._M_dataplus._M_p._0_1_ = 5;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-bytespersigop","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Equivalent bytes per sigop in transactions for relay and mining (default: %u)",
             &DEFAULT_BYTES_PER_SIGOP);
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-datacarrier","");
  tinyformat::format<bool>
            ((string *)local_58,"Relay and mine data carrier transactions (default: %u)",
             (bool *)&DEFAULT_ACCEPT_DATACARRIER);
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-datacarriersize","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,
             "Relay and mine transactions whose data-carrying raw scriptPubKey is of this size or less (default: %u)"
             ,&MAX_OP_RETURN_RELAY);
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-mempoolfullrbf","");
  tinyformat::format<bool>
            ((string *)local_58,
             "(DEPRECATED) Accept transaction replace-by-fee without requiring replaceability signaling (default: %u)"
             ,(bool *)&DEFAULT_MEMPOOL_FULL_RBF);
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-permitbaremultisig","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Relay transactions creating non-P2SH multisig outputs (default: %u)",
             (bool *)&DEFAULT_PERMIT_BAREMULTISIG);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)pbVar8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-minrelaytxfee=<amt>","");
  FormatMoney_abi_cxx11_((string *)local_178,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "Fees (in %s/kvB) smaller than this are considered zero fee for relaying, mining and transaction creation (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,pbVar8);
  local_198._M_dataplus._M_p._0_1_ = 7;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-whitelistforcerelay","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Add \'forcerelay\' permission to whitelisted peers with default permissions. This will relay transactions even if the transactions were already in the mempool. (default: %d)"
             ,(bool *)&DEFAULT_WHITELISTFORCERELAY);
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-whitelistrelay","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Add \'relay\' permission to whitelisted peers with default permissions. This will accept relayed transactions even when not relaying transactions (default: %d)"
             ,(bool *)&DEFAULT_WHITELISTRELAY);
  local_178._0_4_ = 7;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blockmaxweight=<n>","");
  tinyformat::format<unsigned_int>
            ((string *)local_58,"Set maximum BIP141 block weight (default: %d)",
             &DEFAULT_BLOCK_MAX_WEIGHT);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  local_178._0_4_ = 8;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)pbVar8);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blockmintxfee=<amt>","");
  FormatMoney_abi_cxx11_((string *)local_178,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((string *)local_58,
             (tinyformat *)
             "Set lowest fee rate (in %s/kvB) for transactions to be included in block creation. (default: %s)"
             ,(char *)&CURRENCY_UNIT_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,pbVar8);
  local_198._M_dataplus._M_p._0_1_ = 8;
  local_198._M_dataplus._M_p._1_1_ = _S_red >> 8;
  local_198._M_dataplus._M_p._2_2_ = _S_red >> 0x10;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)&local_198);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((_Base_ptr)local_178._0_8_ != p_Var3) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-blockversion=<n>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Override block version to test forking scenarios","");
  local_178._0_4_ = 8;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rest","");
  tinyformat::format<bool>
            ((string *)local_58,"Accept public REST requests (default: %u)",&DEFAULT_REST_ENABLE);
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcallowip=<ip>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Allow JSON-RPC connections from specified source. Valid values for <ip> are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0), a network/CIDR (e.g. 1.2.3.4/24), all ipv4 (0.0.0.0/0), or all ipv6 (::/0). This option can be specified multiple times"
             ,"");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcauth=<userpw>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Username and HMAC-SHA-256 hashed password for JSON-RPC connections. The field <userpw> comes in the format: <USERNAME>:<SALT>$<HASH>. A canonical python script is included in share/rpcauth. The client then connects normally using the rpcuser=<USERNAME>/rpcpassword=<PASSWORD> pair of arguments. This option can be specified multiple times"
             ,"");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x401,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcbind=<addr>[:port]","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Bind to given address to listen for JSON-RPC connections. Do not expose the RPC server to untrusted networks such as the public internet! This option is ignored unless -rpcallowip is also passed. Port is optional and overrides -rpcport. Use [host]:port notation for IPv6. This option can be specified multiple times (default: 127.0.0.1 and ::1 i.e., localhost)"
             ,"");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x201,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcdoccheck","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Throw a non-fatal error at runtime if the documentation for an RPC is incorrect (default: %u)"
             ,&DEFAULT_RPC_DOC_CHECK);
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpccookiefile=<loc>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Location of the auth cookie. Relative paths will be prefixed by a net-specific datadir location. (default: data dir)"
             ,"");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-rpccookieperms=<readable-by>","");
  tinyformat::format<>
            ((string *)local_58,
             "Set permissions on the RPC auth cookie file so that it is readable by [owner|group|all] (default: owner [via umask 0077])"
            );
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcpassword=<pw>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Password for JSON-RPC connections","");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x401,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcport=<port>","");
  local_198._M_dataplus._M_p._0_1_ = (undefined1)local_1e0->m_rpc_port;
  local_198._M_dataplus._M_p._1_1_ = (undefined1)(local_1e0->m_rpc_port >> 8);
  local_1b8._M_dataplus._M_p._0_1_ = (undefined1)*(uint16_t *)(__pthread_internal_list **)local_1e8;
  local_1b8._M_dataplus._M_p._1_1_ =
       (undefined1)(*(uint16_t *)(__pthread_internal_list **)local_1e8 >> 8);
  local_1d8._M_dataplus._M_p._0_2_ = *(undefined2 *)(__pthread_internal_list **)local_1f0;
  local_244 = CONCAT22(local_244._2_2_,*(undefined2 *)local_1f8);
  local_246 = *(uint16_t *)local_200;
  tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
            ((string *)local_58,
             (tinyformat *)
             "Listen for JSON-RPC connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u)"
             ,(char *)&local_198,(unsigned_short *)&local_1b8,(unsigned_short *)&local_1d8,
             (unsigned_short *)&local_244,&local_246,
             (unsigned_short *)CONCAT44(uVar12,in_stack_fffffffffffffdb0));
  cVar17 = (char)uVar12;
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x201,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcservertimeout=<n>","");
  tinyformat::format<int>
            ((string *)local_58,"Timeout during HTTP requests (default: %d)",
             &DEFAULT_HTTP_SERVER_TIMEOUT);
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcthreads=<n>","");
  tinyformat::format<int>
            ((string *)local_58,"Set the number of threads to service RPC calls (default: %d)",
             &DEFAULT_HTTP_THREADS);
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcuser=<user>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Username for JSON-RPC connections","");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x401,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"-rpcwhitelist=<whitelist>","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Set a whitelist to filter incoming RPC calls for a specific user. The field <whitelist> comes in the format: <USERNAME>:<rpc 1>,<rpc 2>,...,<rpc n>. If multiple whitelists are set for a given user, they are set-intersected. See -rpcwhitelistdefault documentation for information on default whitelist behavior."
             ,"");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcwhitelistdefault","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "Sets default behavior for rpc whitelisting. Unless rpcwhitelistdefault is set to 0, if any -rpcwhitelist is set, the rpc server acts as if all rpc users are subject to empty-unless-otherwise-specified whitelists. If rpcwhitelistdefault is set to 1 and no -rpcwhitelist is set, rpc server acts as if all rpc users are subject to empty whitelists."
             ,"");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-rpcworkqueue=<n>","");
  tinyformat::format<int>
            ((string *)local_58,"Set the depth of the work queue to service RPC calls (default: %d)"
             ,&DEFAULT_HTTP_WORKQUEUE);
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,0x101,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-server","");
  local_58._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Accept command line and JSON-RPC commands","");
  local_178._0_4_ = 9;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (cVar17 != '\0') {
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-ipcbind=<address>","");
    local_58._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,
               "Bind to Unix socket address and listen for incoming connections. Valid address values are \"unix\" to listen on the default path, <datadir>/node.sock, or \"unix:/custom/path\" to specify a custom path. Can be specified multiple times to listen on multiple paths. Default behavior is not to listen on any path. If relative paths are specified, they are interpreted relative to the network data directory. If paths include any parent directory components and the parent directories do not exist, they will be created."
               ,"");
    local_178._0_4_ = 0xe;
    ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
    if ((pointer)local_58._0_8_ != pcVar2) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-daemon","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Run in the background as a daemon and accept commands (default: %d)",&DEFAULT_DAEMON);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"-daemonwait","");
  tinyformat::format<bool>
            ((string *)local_58,
             "Wait for initialization to be finished before exiting. This implies -daemon (default: %d)"
             ,&DEFAULT_DAEMONWAIT);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  ArgsManager::AddArg(argsman,&local_158,(string *)local_58,1,(OptionsCategory *)local_178);
  if ((pointer)local_58._0_8_ != pcVar2) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::AddHiddenArgs(argsman,&local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_228);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_220);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_218);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_210);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_208);
  if ((CBaseChainParams *)local_200 != (CBaseChainParams *)0x0) {
    std::default_delete<CBaseChainParams>::operator()
              ((default_delete<CBaseChainParams> *)&local_200,(CBaseChainParams *)local_200);
  }
  if (local_1f8 != (default_delete<CBaseChainParams>  [8])0x0) {
    std::default_delete<CBaseChainParams>::operator()(local_1f8,(CBaseChainParams *)local_1f8);
  }
  if (local_1f0 != (default_delete<CBaseChainParams>  [8])0x0) {
    std::default_delete<CBaseChainParams>::operator()(local_1f0,(CBaseChainParams *)local_1f0);
  }
  if (local_1e8 != (default_delete<CBaseChainParams>  [8])0x0) {
    std::default_delete<CBaseChainParams>::operator()(local_1e8,(CBaseChainParams *)local_1e8);
  }
  if (local_1e0 != (CBaseChainParams *)0x0) {
    std::default_delete<CBaseChainParams>::operator()
              ((default_delete<CBaseChainParams> *)&local_1e0,local_1e0);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == (pointer)local_58._32_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetupServerArgs(ArgsManager& argsman, bool can_listen_ipc)
{
    SetupHelpOptions(argsman);
    argsman.AddArg("-help-debug", "Print help message with debugging options and exit", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST); // server-only for now

    init::AddLoggingArgs(argsman);

    const auto defaultBaseParams = CreateBaseChainParams(ChainType::MAIN);
    const auto testnetBaseParams = CreateBaseChainParams(ChainType::TESTNET);
    const auto testnet4BaseParams = CreateBaseChainParams(ChainType::TESTNET4);
    const auto signetBaseParams = CreateBaseChainParams(ChainType::SIGNET);
    const auto regtestBaseParams = CreateBaseChainParams(ChainType::REGTEST);
    const auto defaultChainParams = CreateChainParams(argsman, ChainType::MAIN);
    const auto testnetChainParams = CreateChainParams(argsman, ChainType::TESTNET);
    const auto testnet4ChainParams = CreateChainParams(argsman, ChainType::TESTNET4);
    const auto signetChainParams = CreateChainParams(argsman, ChainType::SIGNET);
    const auto regtestChainParams = CreateChainParams(argsman, ChainType::REGTEST);

    // Hidden Options
    std::vector<std::string> hidden_args = {
        "-dbcrashratio", "-forcecompactdb",
        // GUI args. These will be overwritten by SetupUIArgs for the GUI
        "-choosedatadir", "-lang=<lang>", "-min", "-resetguisettings", "-splash", "-uiplatform"};

    argsman.AddArg("-version", "Print version and exit", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#if HAVE_SYSTEM
    argsman.AddArg("-alertnotify=<cmd>", "Execute command when an alert is raised (%s in cmd is replaced by message)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#endif
    argsman.AddArg("-assumevalid=<hex>", strprintf("If this block is in the chain assume that it and its ancestors are valid and potentially skip their script verification (0 to verify all, default: %s, testnet3: %s, testnet4: %s, signet: %s)", defaultChainParams->GetConsensus().defaultAssumeValid.GetHex(), testnetChainParams->GetConsensus().defaultAssumeValid.GetHex(), testnet4ChainParams->GetConsensus().defaultAssumeValid.GetHex(), signetChainParams->GetConsensus().defaultAssumeValid.GetHex()), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blocksdir=<dir>", "Specify directory to hold blocks subdirectory for *.dat files (default: <datadir>)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blocksxor",
                   strprintf("Whether an XOR-key applies to blocksdir *.dat files. "
                             "The created XOR-key will be zeros for an existing blocksdir or when `-blocksxor=0` is "
                             "set, and random for a freshly initialized blocksdir. "
                             "(default: %u)",
                             kernel::DEFAULT_XOR_BLOCKSDIR),
                   ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-fastprune", "Use smaller block files and lower minimum prune height for testing purposes", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
#if HAVE_SYSTEM
    argsman.AddArg("-blocknotify=<cmd>", "Execute command when the best block changes (%s in cmd is replaced by block hash)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#endif
    argsman.AddArg("-blockreconstructionextratxn=<n>", strprintf("Extra transactions to keep in memory for compact block reconstructions (default: %u)", DEFAULT_BLOCK_RECONSTRUCTION_EXTRA_TXN), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blocksonly", strprintf("Whether to reject transactions from network peers. Disables automatic broadcast and rebroadcast of transactions, unless the source peer has the 'forcerelay' permission. RPC transactions are not affected. (default: %u)", DEFAULT_BLOCKSONLY), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-coinstatsindex", strprintf("Maintain coinstats index used by the gettxoutsetinfo RPC (default: %u)", DEFAULT_COINSTATSINDEX), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-conf=<file>", strprintf("Specify path to read-only configuration file. Relative paths will be prefixed by datadir location (only useable from command line, not configuration file) (default: %s)", BITCOIN_CONF_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-datadir=<dir>", "Specify data directory", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-dbbatchsize", strprintf("Maximum database write batch size in bytes (default: %u)", nDefaultDbBatchSize), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::OPTIONS);
    argsman.AddArg("-dbcache=<n>", strprintf("Maximum database cache size <n> MiB (minimum %d, default: %d). Make sure you have enough RAM. In addition, unused memory allocated to the mempool is shared with this cache (see -maxmempool).", nMinDbCache, nDefaultDbCache), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-includeconf=<file>", "Specify additional configuration file, relative to the -datadir path (only useable from configuration file, not command line)", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-allowignoredconf", strprintf("For backwards compatibility, treat an unused %s file in the datadir as a warning, not an error.", BITCOIN_CONF_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-loadblock=<file>", "Imports blocks from external file on startup", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-maxmempool=<n>", strprintf("Keep the transaction memory pool below <n> megabytes (default: %u)", DEFAULT_MAX_MEMPOOL_SIZE_MB), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-maxorphantx=<n>", strprintf("Keep at most <n> unconnectable transactions in memory (default: %u)", DEFAULT_MAX_ORPHAN_TRANSACTIONS), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-mempoolexpiry=<n>", strprintf("Do not keep transactions in the mempool longer than <n> hours (default: %u)", DEFAULT_MEMPOOL_EXPIRY_HOURS), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-minimumchainwork=<hex>", strprintf("Minimum work assumed to exist on a valid chain in hex (default: %s, testnet3: %s, testnet4: %s, signet: %s)", defaultChainParams->GetConsensus().nMinimumChainWork.GetHex(), testnetChainParams->GetConsensus().nMinimumChainWork.GetHex(), testnet4ChainParams->GetConsensus().nMinimumChainWork.GetHex(), signetChainParams->GetConsensus().nMinimumChainWork.GetHex()), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::OPTIONS);
    argsman.AddArg("-par=<n>", strprintf("Set the number of script verification threads (0 = auto, up to %d, <0 = leave that many cores free, default: %d)",
        MAX_SCRIPTCHECK_THREADS, DEFAULT_SCRIPTCHECK_THREADS), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-persistmempool", strprintf("Whether to save the mempool on shutdown and load on restart (default: %u)", DEFAULT_PERSIST_MEMPOOL), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-persistmempoolv1",
                   strprintf("Whether a mempool.dat file created by -persistmempool or the savemempool RPC will be written in the legacy format "
                             "(version 1) or the current format (version 2). This temporary option will be removed in the future. (default: %u)",
                             DEFAULT_PERSIST_V1_DAT),
                   ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-pid=<file>", strprintf("Specify pid file. Relative paths will be prefixed by a net-specific datadir location. (default: %s)", BITCOIN_PID_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-prune=<n>", strprintf("Reduce storage requirements by enabling pruning (deleting) of old blocks. This allows the pruneblockchain RPC to be called to delete specific blocks and enables automatic pruning of old blocks if a target size in MiB is provided. This mode is incompatible with -txindex. "
            "Warning: Reverting this setting requires re-downloading the entire blockchain. "
            "(default: 0 = disable pruning blocks, 1 = allow manual pruning via RPC, >=%u = automatically prune block files to stay under the specified target size in MiB)", MIN_DISK_SPACE_FOR_BLOCK_FILES / 1024 / 1024), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-reindex", "If enabled, wipe chain state and block index, and rebuild them from blk*.dat files on disk. Also wipe and rebuild other optional indexes that are active. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC.", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-reindex-chainstate", "If enabled, wipe chain state, and rebuild it from blk*.dat files on disk. If an assumeutxo snapshot was loaded, its chainstate will be wiped as well. The snapshot can then be reloaded via RPC.", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-settings=<file>", strprintf("Specify path to dynamic settings data file. Can be disabled with -nosettings. File is written at runtime and not meant to be edited by users (use %s instead for custom settings). Relative paths will be prefixed by datadir location. (default: %s)", BITCOIN_CONF_FILENAME, BITCOIN_SETTINGS_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#if HAVE_SYSTEM
    argsman.AddArg("-startupnotify=<cmd>", "Execute command on startup.", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-shutdownnotify=<cmd>", "Execute command immediately before beginning shutdown. The need for shutdown may be urgent, so be careful not to delay it long (if the command doesn't require interaction with the server, consider having it fork into the background).", ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#endif
    argsman.AddArg("-txindex", strprintf("Maintain a full transaction index, used by the getrawtransaction rpc call (default: %u)", DEFAULT_TXINDEX), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-blockfilterindex=<type>",
                 strprintf("Maintain an index of compact filters by block (default: %s, values: %s).", DEFAULT_BLOCKFILTERINDEX, ListBlockFilterTypes()) +
                 " If <type> is not supplied or if <type> = 1, indexes for all known types are enabled.",
                 ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);

    argsman.AddArg("-addnode=<ip>", strprintf("Add a node to connect to and attempt to keep the connection open (see the addnode RPC help for more info). This option can be specified multiple times to add multiple nodes; connections are limited to %u at a time and are counted separately from the -maxconnections limit.", MAX_ADDNODE_CONNECTIONS), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-asmap=<file>", strprintf("Specify asn mapping used for bucketing of the peers (default: %s). Relative paths will be prefixed by the net-specific datadir location.", DEFAULT_ASMAP_FILENAME), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-bantime=<n>", strprintf("Default duration (in seconds) of manually configured bans (default: %u)", DEFAULT_MISBEHAVING_BANTIME), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-bind=<addr>[:<port>][=onion]", strprintf("Bind to given address and always listen on it (default: 0.0.0.0). Use [host]:port notation for IPv6. Append =onion to tag any incoming connections to that address and port as incoming Tor connections (default: 127.0.0.1:%u=onion, testnet3: 127.0.0.1:%u=onion, testnet4: 127.0.0.1:%u=onion, signet: 127.0.0.1:%u=onion, regtest: 127.0.0.1:%u=onion)", defaultBaseParams->OnionServiceTargetPort(), testnetBaseParams->OnionServiceTargetPort(), testnet4BaseParams->OnionServiceTargetPort(), signetBaseParams->OnionServiceTargetPort(), regtestBaseParams->OnionServiceTargetPort()), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-cjdnsreachable", "If set, then this host is configured for CJDNS (connecting to fc00::/8 addresses would lead us to the CJDNS network, see doc/cjdns.md) (default: 0)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-connect=<ip>", "Connect only to the specified node; -noconnect disables automatic connections (the rules for this peer are the same as for -addnode). This option can be specified multiple times to connect to multiple nodes.", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-discover", "Discover own IP addresses (default: 1 when listening and no -externalip or -proxy)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-dns", strprintf("Allow DNS lookups for -addnode, -seednode and -connect (default: %u)", DEFAULT_NAME_LOOKUP), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-dnsseed", strprintf("Query for peer addresses via DNS lookup, if low on addresses (default: %u unless -connect used or -maxconnections=0)", DEFAULT_DNSSEED), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-externalip=<ip>", "Specify your own public address", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-fixedseeds", strprintf("Allow fixed seeds if DNS seeds don't provide peers (default: %u)", DEFAULT_FIXEDSEEDS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-forcednsseed", strprintf("Always query for peer addresses via DNS lookup (default: %u)", DEFAULT_FORCEDNSSEED), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-listen", strprintf("Accept connections from outside (default: %u if no -proxy, -connect or -maxconnections=0)", DEFAULT_LISTEN), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-listenonion", strprintf("Automatically create Tor onion service (default: %d)", DEFAULT_LISTEN_ONION), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxconnections=<n>", strprintf("Maintain at most <n> automatic connections to peers (default: %u). This limit does not apply to connections manually added via -addnode or the addnode RPC, which have a separate limit of %u.", DEFAULT_MAX_PEER_CONNECTIONS, MAX_ADDNODE_CONNECTIONS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxreceivebuffer=<n>", strprintf("Maximum per-connection receive buffer, <n>*1000 bytes (default: %u)", DEFAULT_MAXRECEIVEBUFFER), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxsendbuffer=<n>", strprintf("Maximum per-connection memory usage for the send buffer, <n>*1000 bytes (default: %u)", DEFAULT_MAXSENDBUFFER), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-maxuploadtarget=<n>", strprintf("Tries to keep outbound traffic under the given target per 24h. Limit does not apply to peers with 'download' permission or blocks created within past week. 0 = no limit (default: %s). Optional suffix units [k|K|m|M|g|G|t|T] (default: M). Lowercase is 1000 base while uppercase is 1024 base", DEFAULT_MAX_UPLOAD_TARGET), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#ifdef HAVE_SOCKADDR_UN
    argsman.AddArg("-onion=<ip:port|path>", "Use separate SOCKS5 proxy to reach peers via Tor onion services, set -noonion to disable (default: -proxy). May be a local file path prefixed with 'unix:'.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#else
    argsman.AddArg("-onion=<ip:port>", "Use separate SOCKS5 proxy to reach peers via Tor onion services, set -noonion to disable (default: -proxy)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#endif
    argsman.AddArg("-i2psam=<ip:port>", "I2P SAM proxy to reach I2P peers and accept I2P connections (default: none)", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-i2pacceptincoming", strprintf("Whether to accept inbound I2P connections (default: %i). Ignored if -i2psam is not set. Listening for inbound I2P connections is done through the SAM proxy, not by binding to a local address and port.", DEFAULT_I2P_ACCEPT_INCOMING), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-onlynet=<net>", "Make automatic outbound connections only to network <net> (" + Join(GetNetworkNames(), ", ") + "). Inbound and manual connections are not affected by this option. It can be specified multiple times to allow multiple networks.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-v2transport", strprintf("Support v2 transport (default: %u)", DEFAULT_V2_TRANSPORT), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-peerbloomfilters", strprintf("Support filtering of blocks and transaction with bloom filters (default: %u)", DEFAULT_PEERBLOOMFILTERS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-peerblockfilters", strprintf("Serve compact block filters to peers per BIP 157 (default: %u)", DEFAULT_PEERBLOCKFILTERS), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-txreconciliation", strprintf("Enable transaction reconciliations per BIP 330 (default: %d)", DEFAULT_TXRECONCILIATION_ENABLE), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-port=<port>", strprintf("Listen for connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u). Not relevant for I2P (see doc/i2p.md).", defaultChainParams->GetDefaultPort(), testnetChainParams->GetDefaultPort(), testnet4ChainParams->GetDefaultPort(), signetChainParams->GetDefaultPort(), regtestChainParams->GetDefaultPort()), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::CONNECTION);
#ifdef HAVE_SOCKADDR_UN
    argsman.AddArg("-proxy=<ip:port|path>", "Connect through SOCKS5 proxy, set -noproxy to disable (default: disabled). May be a local file path prefixed with 'unix:' if the proxy supports it.", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_ELISION, OptionsCategory::CONNECTION);
#else
    argsman.AddArg("-proxy=<ip:port>", "Connect through SOCKS5 proxy, set -noproxy to disable (default: disabled)", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_ELISION, OptionsCategory::CONNECTION);
#endif
    argsman.AddArg("-proxyrandomize", strprintf("Randomize credentials for every proxy connection. This enables Tor stream isolation (default: %u)", DEFAULT_PROXYRANDOMIZE), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-seednode=<ip>", "Connect to a node to retrieve peer addresses, and disconnect. This option can be specified multiple times to connect to multiple nodes. During startup, seednodes will be tried before dnsseeds.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-networkactive", "Enable all P2P network activity (default: 1). Can be changed by the setnetworkactive RPC command", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-timeout=<n>", strprintf("Specify socket connection timeout in milliseconds. If an initial attempt to connect is unsuccessful after this amount of time, drop it (minimum: 1, default: %d)", DEFAULT_CONNECT_TIMEOUT), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-peertimeout=<n>", strprintf("Specify a p2p connection timeout delay in seconds. After connecting to a peer, wait this amount of time before considering disconnection based on inactivity (minimum: 1, default: %d)", DEFAULT_PEER_CONNECT_TIMEOUT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CONNECTION);
    argsman.AddArg("-torcontrol=<ip>:<port>", strprintf("Tor control host and port to use if onion listening enabled (default: %s). If no port is specified, the default port of %i will be used.", DEFAULT_TOR_CONTROL, DEFAULT_TOR_CONTROL_PORT), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
    argsman.AddArg("-torpassword=<pass>", "Tor control port password (default: empty)", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::CONNECTION);
#ifdef USE_UPNP
    argsman.AddArg("-upnp", strprintf("Use UPnP to map the listening port (default: %u)", DEFAULT_UPNP), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#else
    hidden_args.emplace_back("-upnp");
#endif
#ifdef USE_NATPMP
    argsman.AddArg("-natpmp", strprintf("Use NAT-PMP to map the listening port (default: %u)", DEFAULT_NATPMP), ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);
#else
    hidden_args.emplace_back("-natpmp");
#endif // USE_NATPMP
    argsman.AddArg("-whitebind=<[permissions@]addr>", "Bind to the given address and add permission flags to the peers connecting to it. "
        "Use [host]:port notation for IPv6. Allowed permissions: " + Join(NET_PERMISSIONS_DOC, ", ") + ". "
        "Specify multiple permissions separated by commas (default: download,noban,mempool,relay). Can be specified multiple times.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);

    argsman.AddArg("-whitelist=<[permissions@]IP address or network>", "Add permission flags to the peers using the given IP address (e.g. 1.2.3.4) or "
        "CIDR-notated network (e.g. 1.2.3.0/24). Uses the same permissions as "
        "-whitebind. "
        "Additional flags \"in\" and \"out\" control whether permissions apply to incoming connections and/or manual (default: incoming only). "
        "Can be specified multiple times.", ArgsManager::ALLOW_ANY, OptionsCategory::CONNECTION);

    g_wallet_init_interface.AddWalletOptions(argsman);

#ifdef ENABLE_ZMQ
    argsman.AddArg("-zmqpubhashblock=<address>", "Enable publish hash block in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubhashtx=<address>", "Enable publish hash transaction in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawblock=<address>", "Enable publish raw block in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawtx=<address>", "Enable publish raw transaction in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubsequence=<address>", "Enable publish hash block and tx sequence in <address>", ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubhashblockhwm=<n>", strprintf("Set publish hash block outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubhashtxhwm=<n>", strprintf("Set publish hash transaction outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawblockhwm=<n>", strprintf("Set publish raw block outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubrawtxhwm=<n>", strprintf("Set publish raw transaction outbound message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
    argsman.AddArg("-zmqpubsequencehwm=<n>", strprintf("Set publish hash sequence message high water mark (default: %d)", CZMQAbstractNotifier::DEFAULT_ZMQ_SNDHWM), ArgsManager::ALLOW_ANY, OptionsCategory::ZMQ);
#else
    hidden_args.emplace_back("-zmqpubhashblock=<address>");
    hidden_args.emplace_back("-zmqpubhashtx=<address>");
    hidden_args.emplace_back("-zmqpubrawblock=<address>");
    hidden_args.emplace_back("-zmqpubrawtx=<address>");
    hidden_args.emplace_back("-zmqpubsequence=<n>");
    hidden_args.emplace_back("-zmqpubhashblockhwm=<n>");
    hidden_args.emplace_back("-zmqpubhashtxhwm=<n>");
    hidden_args.emplace_back("-zmqpubrawblockhwm=<n>");
    hidden_args.emplace_back("-zmqpubrawtxhwm=<n>");
    hidden_args.emplace_back("-zmqpubsequencehwm=<n>");
#endif

    argsman.AddArg("-checkblocks=<n>", strprintf("How many blocks to check at startup (default: %u, 0 = all)", DEFAULT_CHECKBLOCKS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checklevel=<n>", strprintf("How thorough the block verification of -checkblocks is: %s (0-4, default: %u)", Join(CHECKLEVEL_DOC, ", "), DEFAULT_CHECKLEVEL), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkblockindex", strprintf("Do a consistency check for the block tree, chainstate, and other validation data structures every <n> operations. Use 0 to disable. (default: %u, regtest: %u)", defaultChainParams->DefaultConsistencyChecks(), regtestChainParams->DefaultConsistencyChecks()), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkaddrman=<n>", strprintf("Run addrman consistency checks every <n> operations. Use 0 to disable. (default: %u)", DEFAULT_ADDRMAN_CONSISTENCY_CHECKS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkmempool=<n>", strprintf("Run mempool consistency checks every <n> transactions. Use 0 to disable. (default: %u, regtest: %u)", defaultChainParams->DefaultConsistencyChecks(), regtestChainParams->DefaultConsistencyChecks()), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-checkpoints", strprintf("Enable rejection of any forks from the known historical chain until block %s (default: %u)", defaultChainParams->Checkpoints().GetHeight(), DEFAULT_CHECKPOINTS_ENABLED), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-deprecatedrpc=<method>", "Allows deprecated RPC method(s) to be used", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-stopafterblockimport", strprintf("Stop running after importing blocks from disk (default: %u)", DEFAULT_STOPAFTERBLOCKIMPORT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-stopatheight", strprintf("Stop running after reaching the given height in the main chain (default: %u)", DEFAULT_STOPATHEIGHT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitancestorcount=<n>", strprintf("Do not accept transactions if number of in-mempool ancestors is <n> or more (default: %u)", DEFAULT_ANCESTOR_LIMIT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitancestorsize=<n>", strprintf("Do not accept transactions whose size with all in-mempool ancestors exceeds <n> kilobytes (default: %u)", DEFAULT_ANCESTOR_SIZE_LIMIT_KVB), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitdescendantcount=<n>", strprintf("Do not accept transactions if any ancestor would have <n> or more in-mempool descendants (default: %u)", DEFAULT_DESCENDANT_LIMIT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-limitdescendantsize=<n>", strprintf("Do not accept transactions if any ancestor would have more than <n> kilobytes of in-mempool descendants (default: %u).", DEFAULT_DESCENDANT_SIZE_LIMIT_KVB), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-test=<option>", "Pass a test-only option. Options include : " + Join(TEST_OPTIONS_DOC, ", ") + ".", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-capturemessages", "Capture all P2P messages to disk", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-mocktime=<n>", "Replace actual time with " + UNIX_EPOCH_TIME + " (default: 0)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-maxsigcachesize=<n>", strprintf("Limit sum of signature cache and script execution cache sizes to <n> MiB (default: %u)", DEFAULT_VALIDATION_CACHE_BYTES >> 20), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-maxtipage=<n>",
                   strprintf("Maximum tip age in seconds to consider node in initial block download (default: %u)",
                             Ticks<std::chrono::seconds>(DEFAULT_MAX_TIP_AGE)),
                   ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-printpriority", strprintf("Log transaction fee rate in " + CURRENCY_UNIT + "/kvB when mining blocks (default: %u)", DEFAULT_PRINT_MODIFIED_FEE), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-uacomment=<cmt>", "Append comment to the user agent string", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);

    SetupChainParamsBaseOptions(argsman);

    argsman.AddArg("-acceptnonstdtxn", strprintf("Relay and mine \"non-standard\" transactions (test networks only; default: %u)", DEFAULT_ACCEPT_NON_STD_TXN), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-incrementalrelayfee=<amt>", strprintf("Fee rate (in %s/kvB) used to define cost of relay, used for mempool limiting and replacement policy. (default: %s)", CURRENCY_UNIT, FormatMoney(DEFAULT_INCREMENTAL_RELAY_FEE)), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-dustrelayfee=<amt>", strprintf("Fee rate (in %s/kvB) used to define dust, the value of an output such that it will cost more than its value in fees at this fee rate to spend it. (default: %s)", CURRENCY_UNIT, FormatMoney(DUST_RELAY_TX_FEE)), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-acceptstalefeeestimates", strprintf("Read fee estimates even if they are stale (%sdefault: %u) fee estimates are considered stale if they are %s hours old", "regtest only; ", DEFAULT_ACCEPT_STALE_FEE_ESTIMATES, Ticks<std::chrono::hours>(MAX_FILE_AGE)), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-bytespersigop", strprintf("Equivalent bytes per sigop in transactions for relay and mining (default: %u)", DEFAULT_BYTES_PER_SIGOP), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-datacarrier", strprintf("Relay and mine data carrier transactions (default: %u)", DEFAULT_ACCEPT_DATACARRIER), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-datacarriersize",
                   strprintf("Relay and mine transactions whose data-carrying raw scriptPubKey "
                             "is of this size or less (default: %u)",
                             MAX_OP_RETURN_RELAY),
                   ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-mempoolfullrbf", strprintf("(DEPRECATED) Accept transaction replace-by-fee without requiring replaceability signaling (default: %u)", DEFAULT_MEMPOOL_FULL_RBF), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-permitbaremultisig", strprintf("Relay transactions creating non-P2SH multisig outputs (default: %u)", DEFAULT_PERMIT_BAREMULTISIG), ArgsManager::ALLOW_ANY,
                   OptionsCategory::NODE_RELAY);
    argsman.AddArg("-minrelaytxfee=<amt>", strprintf("Fees (in %s/kvB) smaller than this are considered zero fee for relaying, mining and transaction creation (default: %s)",
        CURRENCY_UNIT, FormatMoney(DEFAULT_MIN_RELAY_TX_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-whitelistforcerelay", strprintf("Add 'forcerelay' permission to whitelisted peers with default permissions. This will relay transactions even if the transactions were already in the mempool. (default: %d)", DEFAULT_WHITELISTFORCERELAY), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);
    argsman.AddArg("-whitelistrelay", strprintf("Add 'relay' permission to whitelisted peers with default permissions. This will accept relayed transactions even when not relaying transactions (default: %d)", DEFAULT_WHITELISTRELAY), ArgsManager::ALLOW_ANY, OptionsCategory::NODE_RELAY);


    argsman.AddArg("-blockmaxweight=<n>", strprintf("Set maximum BIP141 block weight (default: %d)", DEFAULT_BLOCK_MAX_WEIGHT), ArgsManager::ALLOW_ANY, OptionsCategory::BLOCK_CREATION);
    argsman.AddArg("-blockmintxfee=<amt>", strprintf("Set lowest fee rate (in %s/kvB) for transactions to be included in block creation. (default: %s)", CURRENCY_UNIT, FormatMoney(DEFAULT_BLOCK_MIN_TX_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::BLOCK_CREATION);
    argsman.AddArg("-blockversion=<n>", "Override block version to test forking scenarios", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::BLOCK_CREATION);

    argsman.AddArg("-rest", strprintf("Accept public REST requests (default: %u)", DEFAULT_REST_ENABLE), ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcallowip=<ip>", "Allow JSON-RPC connections from specified source. Valid values for <ip> are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0), a network/CIDR (e.g. 1.2.3.4/24), all ipv4 (0.0.0.0/0), or all ipv6 (::/0). This option can be specified multiple times", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcauth=<userpw>", "Username and HMAC-SHA-256 hashed password for JSON-RPC connections. The field <userpw> comes in the format: <USERNAME>:<SALT>$<HASH>. A canonical python script is included in share/rpcauth. The client then connects normally using the rpcuser=<USERNAME>/rpcpassword=<PASSWORD> pair of arguments. This option can be specified multiple times", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::RPC);
    argsman.AddArg("-rpcbind=<addr>[:port]", "Bind to given address to listen for JSON-RPC connections. Do not expose the RPC server to untrusted networks such as the public internet! This option is ignored unless -rpcallowip is also passed. Port is optional and overrides -rpcport. Use [host]:port notation for IPv6. This option can be specified multiple times (default: 127.0.0.1 and ::1 i.e., localhost)", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpcdoccheck", strprintf("Throw a non-fatal error at runtime if the documentation for an RPC is incorrect (default: %u)", DEFAULT_RPC_DOC_CHECK), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpccookiefile=<loc>", "Location of the auth cookie. Relative paths will be prefixed by a net-specific datadir location. (default: data dir)", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpccookieperms=<readable-by>", strprintf("Set permissions on the RPC auth cookie file so that it is readable by [owner|group|all] (default: owner [via umask 0077])"), ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcpassword=<pw>", "Password for JSON-RPC connections", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::RPC);
    argsman.AddArg("-rpcport=<port>", strprintf("Listen for JSON-RPC connections on <port> (default: %u, testnet3: %u, testnet4: %u, signet: %u, regtest: %u)", defaultBaseParams->RPCPort(), testnetBaseParams->RPCPort(), testnet4BaseParams->RPCPort(), signetBaseParams->RPCPort(), regtestBaseParams->RPCPort()), ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpcservertimeout=<n>", strprintf("Timeout during HTTP requests (default: %d)", DEFAULT_HTTP_SERVER_TIMEOUT), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-rpcthreads=<n>", strprintf("Set the number of threads to service RPC calls (default: %d)", DEFAULT_HTTP_THREADS), ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcuser=<user>", "Username for JSON-RPC connections", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE, OptionsCategory::RPC);
    argsman.AddArg("-rpcwhitelist=<whitelist>", "Set a whitelist to filter incoming RPC calls for a specific user. The field <whitelist> comes in the format: <USERNAME>:<rpc 1>,<rpc 2>,...,<rpc n>. If multiple whitelists are set for a given user, they are set-intersected. See -rpcwhitelistdefault documentation for information on default whitelist behavior.", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcwhitelistdefault", "Sets default behavior for rpc whitelisting. Unless rpcwhitelistdefault is set to 0, if any -rpcwhitelist is set, the rpc server acts as if all rpc users are subject to empty-unless-otherwise-specified whitelists. If rpcwhitelistdefault is set to 1 and no -rpcwhitelist is set, rpc server acts as if all rpc users are subject to empty whitelists.", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    argsman.AddArg("-rpcworkqueue=<n>", strprintf("Set the depth of the work queue to service RPC calls (default: %d)", DEFAULT_HTTP_WORKQUEUE), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::RPC);
    argsman.AddArg("-server", "Accept command line and JSON-RPC commands", ArgsManager::ALLOW_ANY, OptionsCategory::RPC);
    if (can_listen_ipc) {
        argsman.AddArg("-ipcbind=<address>", "Bind to Unix socket address and listen for incoming connections. Valid address values are \"unix\" to listen on the default path, <datadir>/node.sock, or \"unix:/custom/path\" to specify a custom path. Can be specified multiple times to listen on multiple paths. Default behavior is not to listen on any path. If relative paths are specified, they are interpreted relative to the network data directory. If paths include any parent directory components and the parent directories do not exist, they will be created.", ArgsManager::ALLOW_ANY, OptionsCategory::IPC);
    }

#if HAVE_DECL_FORK
    argsman.AddArg("-daemon", strprintf("Run in the background as a daemon and accept commands (default: %d)", DEFAULT_DAEMON), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
    argsman.AddArg("-daemonwait", strprintf("Wait for initialization to be finished before exiting. This implies -daemon (default: %d)", DEFAULT_DAEMONWAIT), ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
#else
    hidden_args.emplace_back("-daemon");
    hidden_args.emplace_back("-daemonwait");
#endif

    // Add the hidden options
    argsman.AddHiddenArgs(hidden_args);
}